

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::CLOSURE_OP(SQVM *this,SQObjectPtr *target,SQFunctionProto *func)

{
  SQOuterVar *pSVar1;
  SQSharedState *ss;
  long lVar2;
  SQWeakRef *root;
  SQClosure *x;
  SQInteger spos;
  SQInteger i_1;
  SQInteger ndefparams;
  SQOuterVar *v;
  SQInteger i;
  SQClosure *closure;
  SQInteger nouters;
  SQFunctionProto *func_local;
  SQObjectPtr *target_local;
  SQVM *this_local;
  
  ss = this->_sharedstate;
  root = SQRefCounted::GetWeakRef((this->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
  x = SQClosure::Create(ss,func,root);
  lVar2 = func->_noutervalues;
  if (lVar2 != 0) {
    for (v = (SQOuterVar *)0x0; (long)v < lVar2; v = (SQOuterVar *)((long)&v->_type + 1)) {
      pSVar1 = func->_outervalues + (long)v;
      if (pSVar1->_type == otLOCAL) {
        FindOuter(this,x->_outervalues + (long)v,
                  (this->_stack)._vals +
                  (long)&(((pSVar1->_src).super_SQObject._unVal.pTable)->super_SQDelegable).
                         super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted +
                  this->_stackbase);
      }
      else if (pSVar1->_type == otOUTER) {
        ::SQObjectPtr::operator=
                  (x->_outervalues + (long)v,
                   ((this->ci->_closure).super_SQObject._unVal.pClosure)->_outervalues +
                   (pSVar1->_src).super_SQObject._unVal.nInteger);
      }
    }
  }
  lVar2 = func->_ndefaultparams;
  if (lVar2 != 0) {
    for (spos = 0; spos < lVar2; spos = spos + 1) {
      ::SQObjectPtr::operator=
                (x->_defaultparams + spos,
                 (this->_stack)._vals + this->_stackbase + func->_defaultparams[spos]);
    }
  }
  ::SQObjectPtr::operator=(target,x);
  return true;
}

Assistant:

bool SQVM::CLOSURE_OP(SQObjectPtr &target, SQFunctionProto *func)
{
    SQInteger nouters;
    SQClosure *closure = SQClosure::Create(_ss(this), func,_table(_roottable)->GetWeakRef(OT_TABLE));
    if((nouters = func->_noutervalues)) {
        for(SQInteger i = 0; i<nouters; i++) {
            SQOuterVar &v = func->_outervalues[i];
            switch(v._type){
            case otLOCAL:
                FindOuter(closure->_outervalues[i], &STK(_integer(v._src)));
                break;
            case otOUTER:
                closure->_outervalues[i] = _closure(ci->_closure)->_outervalues[_integer(v._src)];
                break;
            }
        }
    }
    SQInteger ndefparams;
    if((ndefparams = func->_ndefaultparams)) {
        for(SQInteger i = 0; i < ndefparams; i++) {
            SQInteger spos = func->_defaultparams[i];
            closure->_defaultparams[i] = _stack._vals[_stackbase + spos];
        }
    }
    target = closure;
    return true;

}